

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall
DataFilters::addNumericFilter
          (DataFilters *this,uint *index,double *minValue,double *maxValue,bool *isAccept)

{
  pointer *ppNVar1;
  iterator __position;
  NumericFilterCase local_20;
  
  local_20.index = *index;
  local_20.filter._maxValue = *maxValue;
  local_20.filter._minValue = *minValue;
  local_20.filter._isAccept = *isAccept;
  __position._M_current =
       (this->_numericFilters).
       super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_numericFilters).
      super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
    _M_realloc_insert<DataFilters::NumericFilterCase>(&this->_numericFilters,__position,&local_20);
  }
  else {
    ((__position._M_current)->filter)._minValue = local_20.filter._minValue;
    *(ulong *)&((__position._M_current)->filter)._isAccept =
         CONCAT71(local_20.filter._17_7_,local_20.filter._isAccept);
    *(ulong *)__position._M_current = CONCAT44(local_20._4_4_,local_20.index);
    ((__position._M_current)->filter)._maxValue = local_20.filter._maxValue;
    ppNVar1 = &(this->_numericFilters).
               super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  return;
}

Assistant:

void
    addNumericFilter(unsigned int const & index,
                     double const & minValue,
                     double const & maxValue,
                     bool const & isAccept)
    {
        this->_numericFilters.push_back(NumericFilterCase(index, NumericFilter(minValue, maxValue, isAccept)));
    }